

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

times * __thiscall lest::times::operator()(times *this,test *testing)

{
  _Setw _Var1;
  env *__args;
  ostream *poVar2;
  double dVar3;
  message *anon_var_0;
  string local_40 [32];
  timer local_20;
  timer t;
  test *testing_local;
  times *this_local;
  
  t.start.__d.__r = (time_point)(time_point)testing;
  timer::timer(&local_20);
  std::__cxx11::string::string(local_40,(string *)testing);
  __args = env::operator()(&this->output,(text *)local_40);
  std::function<void_(lest::env_&)>::operator()(&testing->behaviour,__args);
  std::__cxx11::string::~string(local_40);
  poVar2 = (this->super_action).os;
  _Var1 = std::setw(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  dVar3 = timer::elapsed_seconds(&local_20);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3 * 1000.0);
  poVar2 = std::operator<<(poVar2," ms: ");
  poVar2 = std::operator<<(poVar2,(string *)testing);
  std::operator<<(poVar2,"\n");
  return this;
}

Assistant:

times & operator()( test testing )
    {
        timer t;

        try
        {
            testing.behaviour( output( testing.name ) );
        }
        catch( message const & )
        {
            ++failures;
        }

        os << std::setw(3) << ( 1000 * t.elapsed_seconds() ) << " ms: " << testing.name  << "\n";

        return *this;
    }